

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool __thiscall Glucose::Solver::addClause_(Solver *this,vec<Glucose::Lit> *ps)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  CRef CVar6;
  Lit *pLVar7;
  uchar *puVar8;
  size_t *siglen;
  size_t *siglen_00;
  size_t *siglen_01;
  size_t *siglen_02;
  vec<Glucose::Lit> *in_RSI;
  uchar *puVar9;
  long in_RDI;
  size_t in_R8;
  CRef cr;
  int flag;
  int j;
  int i;
  Lit p;
  vec<Glucose::Lit> oc;
  undefined4 in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  Solver *in_stack_fffffffffffffde8;
  Lit in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  ClauseAllocator *in_stack_fffffffffffffe00;
  FILE *in_stack_fffffffffffffe10;
  Solver *in_stack_fffffffffffffe18;
  Lit in_stack_fffffffffffffe24;
  Lit *in_stack_fffffffffffffea8;
  CRef cr_00;
  Solver *in_stack_fffffffffffffeb0;
  bool local_133;
  bool local_113;
  bool local_db;
  Solver *in_stack_ffffffffffffff28;
  lbool local_81;
  int local_80;
  uint8_t local_79;
  undefined4 local_78;
  int local_74;
  int local_70;
  lbool local_69;
  int local_68;
  lbool local_62;
  lbool local_61;
  int local_60;
  lbool local_59;
  int local_58;
  int local_54;
  lbool local_4d;
  int local_4c;
  lbool local_45;
  int local_44;
  int local_40;
  uint local_3c;
  Lit local_38;
  vec<Glucose::Lit> local_28;
  vec<Glucose::Lit> *local_18;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x138) & 1) == 0) {
    local_1 = false;
  }
  else {
    local_18 = in_RSI;
    sort<Glucose::Lit>((vec<Glucose::Lit> *)
                       CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    vec<Glucose::Lit>::vec(&local_28);
    vec<Glucose::Lit>::clear
              ((vec<Glucose::Lit> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               SUB41((uint)in_stack_fffffffffffffddc >> 0x18,0));
    local_44 = 0;
    if ((*(byte *)(in_RDI + 0xc0) & 1) != 0) {
      local_40 = 0;
      local_38.x = -2;
      for (local_3c = 0; uVar3 = local_3c, iVar2 = vec<Glucose::Lit>::size(local_18),
          (int)uVar3 < iVar2; local_3c = local_3c + 1) {
        vec<Glucose::Lit>::operator[](local_18,local_3c);
        vec<Glucose::Lit>::push
                  ((vec<Glucose::Lit> *)
                   CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (Lit *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
        in_stack_ffffffffffffff28 = (Solver *)vec<Glucose::Lit>::operator[](local_18,local_3c);
        local_4c = *(int *)&(in_stack_ffffffffffffff28->super_Clone)._vptr_Clone;
        local_45 = value(in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0);
        lbool::lbool(&local_4d,'\0');
        bVar1 = lbool::operator==(&local_45,local_4d);
        local_db = true;
        if (!bVar1) {
          pLVar7 = vec<Glucose::Lit>::operator[](local_18,local_3c);
          local_58 = local_38.x;
          local_54 = (int)operator~(local_38);
          bVar1 = Lit::operator==(pLVar7,(Lit)local_54);
          local_db = true;
          if (!bVar1) {
            pLVar7 = vec<Glucose::Lit>::operator[](local_18,local_3c);
            local_60 = pLVar7->x;
            local_59 = value(in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0);
            lbool::lbool(&local_61,'\x01');
            local_db = lbool::operator==(&local_59,local_61);
          }
        }
        if (local_db != false) {
          local_44 = 1;
        }
      }
    }
    local_40 = 0;
    local_38.x = -2;
    for (local_3c = 0; uVar3 = local_3c, iVar2 = vec<Glucose::Lit>::size(local_18),
        (int)uVar3 < iVar2; local_3c = local_3c + 1) {
      pLVar7 = vec<Glucose::Lit>::operator[](local_18,local_3c);
      local_68 = pLVar7->x;
      local_62 = value(in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0);
      lbool::lbool(&local_69,'\0');
      bVar1 = lbool::operator==(&local_62,local_69);
      local_113 = true;
      if (!bVar1) {
        pLVar7 = vec<Glucose::Lit>::operator[](local_18,local_3c);
        local_74 = local_38.x;
        local_70 = (int)operator~(local_38);
        local_113 = Lit::operator==(pLVar7,(Lit)local_70);
      }
      if (local_113 != false) {
        local_1 = true;
        goto LAB_0011368a;
      }
      pLVar7 = vec<Glucose::Lit>::operator[](local_18,local_3c);
      local_80 = pLVar7->x;
      local_79 = (uint8_t)value(in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0);
      lbool::lbool(&local_81,'\x01');
      bVar1 = lbool::operator!=((lbool *)CONCAT44(in_stack_fffffffffffffddc,
                                                  in_stack_fffffffffffffdd8),
                                (lbool)(uint8_t)((uint)in_stack_fffffffffffffde4 >> 0x18));
      local_133 = false;
      if (bVar1) {
        pLVar7 = vec<Glucose::Lit>::operator[](local_18,local_3c);
        local_133 = Lit::operator!=(pLVar7,local_38);
      }
      if (local_133 != false) {
        in_stack_fffffffffffffeb0 = (Solver *)vec<Glucose::Lit>::operator[](local_18,local_3c);
        iVar2 = local_40;
        local_38.x = *(int *)&(in_stack_fffffffffffffeb0->super_Clone)._vptr_Clone;
        local_40 = local_40 + 1;
        in_stack_fffffffffffffea8 = vec<Glucose::Lit>::operator[](local_18,iVar2);
        in_stack_fffffffffffffea8->x = local_38.x;
      }
    }
    vec<Glucose::Lit>::shrink(local_18,local_3c - local_40);
    cr_00 = (CRef)((ulong)in_stack_fffffffffffffea8 >> 0x20);
    CVar6 = (CRef)((ulong)in_stack_fffffffffffffe10 >> 0x20);
    if ((local_44 != 0) && ((*(byte *)(in_RDI + 0xc0) & 1) != 0)) {
      if ((*(byte *)(in_RDI + 0xc1) & 1) == 0) {
        local_40 = 0;
        local_3c = 0;
        local_38.x = 0xfffffffe;
        while( true ) {
          uVar3 = local_3c;
          uVar4 = vec<Glucose::Lit>::size(local_18);
          puVar8 = (uchar *)(ulong)uVar4;
          if ((int)uVar4 <= (int)uVar3) break;
          __stream = *(FILE **)(in_RDI + 0xb8);
          pLVar7 = vec<Glucose::Lit>::operator[](local_18,local_3c);
          iVar2 = var((Lit)pLVar7->x);
          puVar9 = (uchar *)(ulong)local_3c;
          pLVar7 = vec<Glucose::Lit>::operator[](local_18,local_3c);
          iVar5 = sign((EVP_PKEY_CTX *)(ulong)(uint)pLVar7->x,puVar9,siglen_01,puVar8,in_R8);
          fprintf(__stream,"%i ",(ulong)((iVar2 + 1) * ((uint)((byte)iVar5 & 1) * -2 + 1)));
          local_3c = local_3c + 1;
        }
        fprintf(*(FILE **)(in_RDI + 0xb8),"0\n");
        fprintf(*(FILE **)(in_RDI + 0xb8),"d ");
        local_40 = 0;
        local_3c = 0;
        local_38.x = -2;
        while( true ) {
          uVar3 = local_3c;
          CVar6 = (CRef)((ulong)in_stack_fffffffffffffe10 >> 0x20);
          in_stack_fffffffffffffe24.x = vec<Glucose::Lit>::size(&local_28);
          cr_00 = (CRef)((ulong)in_stack_fffffffffffffea8 >> 0x20);
          puVar8 = (uchar *)(ulong)(uint)in_stack_fffffffffffffe24.x;
          if (in_stack_fffffffffffffe24.x <= (int)uVar3) break;
          in_stack_fffffffffffffe10 = *(FILE **)(in_RDI + 0xb8);
          in_stack_fffffffffffffe18 = (Solver *)vec<Glucose::Lit>::operator[](&local_28,local_3c);
          in_stack_fffffffffffffdfc =
               var((Lit)*(int *)&(in_stack_fffffffffffffe18->super_Clone)._vptr_Clone);
          in_stack_fffffffffffffdfc = in_stack_fffffffffffffdfc + 1;
          puVar9 = (uchar *)(ulong)local_3c;
          in_stack_fffffffffffffe00 =
               (ClauseAllocator *)vec<Glucose::Lit>::operator[](&local_28,local_3c);
          iVar2 = sign((EVP_PKEY_CTX *)
                       (ulong)*(uint *)&(in_stack_fffffffffffffe00->
                                        super_RegionAllocator<unsigned_int>).memory,puVar9,siglen_02
                       ,puVar8,in_R8);
          in_stack_fffffffffffffdf8 = CONCAT13((byte)iVar2,(int3)in_stack_fffffffffffffdf8);
          fprintf(in_stack_fffffffffffffe10,"%i ",
                  (ulong)(in_stack_fffffffffffffdfc * ((uint)((byte)iVar2 & 1) * -2 + 1)));
          local_3c = local_3c + 1;
        }
        fprintf(*(FILE **)(in_RDI + 0xb8),"0\n");
      }
      else {
        write_char((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (uchar)((uint)in_stack_fffffffffffffddc >> 0x18));
        local_40 = 0;
        local_38.x = 0xfffffffe;
        for (local_3c = 0; uVar3 = local_3c, iVar2 = vec<Glucose::Lit>::size(local_18),
            (int)uVar3 < iVar2; local_3c = local_3c + 1) {
          pLVar7 = vec<Glucose::Lit>::operator[](local_18,local_3c);
          uVar3 = var((Lit)pLVar7->x);
          puVar8 = (uchar *)(ulong)uVar3;
          puVar9 = (uchar *)(ulong)local_3c;
          pLVar7 = vec<Glucose::Lit>::operator[](local_18,local_3c);
          sign((EVP_PKEY_CTX *)(ulong)(uint)pLVar7->x,puVar9,siglen,puVar8,in_R8);
          write_lit((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                    in_stack_fffffffffffffddc);
        }
        write_lit((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                  in_stack_fffffffffffffddc);
        write_char((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (uchar)((uint)in_stack_fffffffffffffddc >> 0x18));
        local_40 = 0;
        local_3c = 0;
        local_38.x = -2;
        while( true ) {
          uVar3 = local_3c;
          iVar2 = vec<Glucose::Lit>::size(&local_28);
          cr_00 = (CRef)((ulong)in_stack_fffffffffffffea8 >> 0x20);
          CVar6 = (CRef)((ulong)in_stack_fffffffffffffe10 >> 0x20);
          if (iVar2 <= (int)uVar3) break;
          pLVar7 = vec<Glucose::Lit>::operator[](&local_28,local_3c);
          uVar3 = var((Lit)pLVar7->x);
          puVar8 = (uchar *)(ulong)uVar3;
          puVar9 = (uchar *)(ulong)local_3c;
          pLVar7 = vec<Glucose::Lit>::operator[](&local_28,local_3c);
          sign((EVP_PKEY_CTX *)(ulong)(uint)pLVar7->x,puVar9,siglen_00,puVar8,in_R8);
          write_lit((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                    in_stack_fffffffffffffddc);
          local_3c = local_3c + 1;
        }
        write_lit((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                  in_stack_fffffffffffffddc);
      }
    }
    iVar2 = vec<Glucose::Lit>::size(local_18);
    if (iVar2 == 0) {
      *(undefined1 *)(in_RDI + 0x138) = 0;
      local_1 = false;
    }
    else {
      iVar5 = vec<Glucose::Lit>::size(local_18);
      if (iVar5 == 1) {
        vec<Glucose::Lit>::operator[](local_18,0);
        uncheckedEnqueue(in_stack_fffffffffffffe18,in_stack_fffffffffffffe24,CVar6);
        CVar6 = propagate(in_stack_ffffffffffffff28);
        local_1 = CVar6 == 0xffffffff;
        *(bool *)(in_RDI + 0x138) = local_1;
      }
      else {
        CVar6 = ClauseAllocator::alloc<Glucose::vec<Glucose::Lit>>
                          (in_stack_fffffffffffffe00,
                           (vec<Glucose::Lit> *)
                           CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                           SUB41((uint)iVar2 >> 0x18,0),SUB41((uint)iVar2 >> 0x10,0));
        vec<unsigned_int>::push
                  ((vec<unsigned_int> *)CONCAT44(in_stack_fffffffffffffde4,CVar6),
                   (uint *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
        attachClause(in_stack_fffffffffffffeb0,cr_00);
        local_1 = true;
      }
    }
LAB_0011368a:
    local_78 = 1;
    vec<Glucose::Lit>::~vec((vec<Glucose::Lit> *)0x113697);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Solver::addClause_(vec <Lit> &ps) {

    assert(decisionLevel() == 0);
    if(!ok) return false;

    // Check if clause is satisfied and remove false/duplicate literals:
    sort(ps);

    vec <Lit> oc;
    oc.clear();

    Lit p;
    int i, j, flag = 0;
    if(certifiedUNSAT) {
        for(i = j = 0, p = lit_Undef; i < ps.size(); i++) {
            oc.push(ps[i]);
            if(value(ps[i]) == l_True || ps[i] == ~p || value(ps[i]) == l_False)
                flag = 1;
        }
    }

    for(i = j = 0, p = lit_Undef; i < ps.size(); i++)
        if(value(ps[i]) == l_True || ps[i] == ~p)
            return true;
        else if(value(ps[i]) != l_False && ps[i] != p)
            ps[j++] = p = ps[i];
    ps.shrink(i - j);

    if(flag && (certifiedUNSAT)) {
        if(vbyte) {
            write_char('a');
            for(i = j = 0, p = lit_Undef; i < ps.size(); i++)
                write_lit(2 * (var(ps[i]) + 1) + sign(ps[i]));
            write_lit(0);

            write_char('d');
            for(i = j = 0, p = lit_Undef; i < oc.size(); i++)
                write_lit(2 * (var(oc[i]) + 1) + sign(oc[i]));
            write_lit(0);
        }
        else {
            for(i = j = 0, p = lit_Undef; i < ps.size(); i++)
                fprintf(certifiedOutput, "%i ", (var(ps[i]) + 1) * (-2 * sign(ps[i]) + 1));
            fprintf(certifiedOutput, "0\n");

            fprintf(certifiedOutput, "d ");
            for(i = j = 0, p = lit_Undef; i < oc.size(); i++)
                fprintf(certifiedOutput, "%i ", (var(oc[i]) + 1) * (-2 * sign(oc[i]) + 1));
            fprintf(certifiedOutput, "0\n");
        }
    }


    if(ps.size() == 0)
        return ok = false;
    else if(ps.size() == 1) {
        uncheckedEnqueue(ps[0]);
        return ok = (propagate() == CRef_Undef);
    } else {
        CRef cr = ca.alloc(ps, false);
        clauses.push(cr);
        attachClause(cr);
    }

    return true;
}